

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_TestShell::
TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_TestShell
          (TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_TestShell_003e4318;
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, DeleteNonAlocatedMemory)
{
    char a;
    char* pa = &a;
    detector->deallocMemory(defaultMallocAllocator(), pa, "FREE.c", 100);
    detector->stopChecking();
    CHECK(reporter->message->contains("Deallocating non-allocated memory"));
    CHECK(reporter->message->contains("   allocated at file: <unknown> line: 0 size: 0 type: unknown"));
    CHECK(reporter->message->contains("   deallocated at file: FREE.c line: 100 type: free"));
}